

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::InsertRuleLauncher
          (cmLocalGenerator *this,string *s,cmGeneratorTarget *target,string *prop)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream wrapped;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pcVar1 = GetRuleLauncher(this,target,prop);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,pcVar1);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)s);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)s,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return;
}

Assistant:

void cmLocalGenerator::InsertRuleLauncher(std::string& s,
                                          cmGeneratorTarget* target,
                                          const std::string& prop)
{
  if(const char* val = this->GetRuleLauncher(target, prop))
    {
    std::ostringstream wrapped;
    wrapped << val << " " << s;
    s = wrapped.str();
    }
}